

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

int __thiscall ThreadPool::remove(ThreadPool *this,char *__filename)

{
  int extraout_EAX;
  
  std::mutex::lock((mutex *)__filename);
  std::__cxx11::list<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>::remove
            (&this->_task,&stack0xfffffffffffffff0);
  std::mutex::unlock((mutex *)0x13b338);
  return extraout_EAX;
}

Assistant:

void ThreadPool::remove( AbstractTaskProvider * provider )
{
    _taskInfo.lock();

    _task.remove( provider );

    _taskInfo.unlock();
}